

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Wrd_t * Gia_ManSimRel(Gia_Man_t *p,Vec_Int_t *vObjs,Vec_Wrd_t *vVals)

{
  int nWordsIn;
  int iVar1;
  Vec_Wrd_t *vRel_00;
  Vec_Wrd_t *vSims;
  word *__s;
  Gia_Obj_t *pGVar2;
  byte bVar3;
  uint uVar4;
  int __c;
  int iVar5;
  Vec_Wrd_t *vSimsIn;
  uint uVar6;
  uint nSize;
  Vec_Wrd_t *vRel;
  
  nWordsIn = p->vSimsPi->nSize / p->vCis->nSize;
  bVar3 = (byte)vObjs->nSize;
  uVar6 = 1 << (bVar3 & 0x1f);
  nSize = nWordsIn << (bVar3 & 0x1f);
  vRel_00 = Vec_WrdStart(nSize);
  vRel = vRel_00;
  vSims = Vec_WrdStart(p->nObjs * nWordsIn << (bVar3 & 0x1f));
  vSimsIn = p->vSimsPi;
  Gia_ManSimRelAssignInputs(p,nSize,vSims,nWordsIn,vSimsIn);
  iVar5 = 0;
  if (1 << (bVar3 & 0x1f) < 1) {
    uVar6 = 0;
    iVar5 = 0;
  }
  for (; iVar5 < vObjs->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vObjs,iVar5);
    iVar1 = (iVar1 << (bVar3 & 0x1f)) * nWordsIn;
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      __s = Vec_WrdEntryP(vSims,iVar1);
      if ((uVar4 & 1 << ((byte)iVar5 & 0x1f)) == 0) {
        __c = 0;
      }
      else {
        __c = 0xff;
      }
      memset(__s,__c,(long)nWordsIn << 3);
      iVar1 = iVar1 + nWordsIn;
    }
  }
  Gia_ManCleanPhase(p);
  for (iVar5 = 0; iVar5 < vObjs->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vObjs,iVar5);
    pGVar2 = Gia_ManObj(p,iVar1);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar2 = *(ulong *)pGVar2 | 0x8000000000000000;
  }
  for (uVar6 = 0; (int)uVar6 < p->nObjs; uVar6 = uVar6 + 1) {
    pGVar2 = Gia_ManObj(p,uVar6);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    if ((*(ulong *)pGVar2 & 0x8000000080000000) == 0 && (~(uint)*(ulong *)pGVar2 & 0x1fffffff) != 0)
    {
      Gia_ManSimPatSimAnd((Gia_Man_t *)(ulong)uVar6,(int)pGVar2,(Gia_Obj_t *)(ulong)nSize,(int)vSims
                          ,vSimsIn);
    }
  }
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pGVar2 = Gia_ManCo(p,iVar5);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    if (-1 < *(long *)pGVar2) {
      uVar6 = Gia_ObjId(p,pGVar2);
      Gia_ManSimPatSimPo((Gia_Man_t *)(ulong)uVar6,(int)pGVar2,(Gia_Obj_t *)(ulong)nSize,(int)vSims,
                         vSimsIn);
    }
  }
  for (iVar5 = 0; iVar5 < vObjs->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vObjs,iVar5);
    pGVar2 = Gia_ManObj(p,iVar1);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0x7fffffffffffffff;
  }
  iVar5 = Gia_ManSimRelCollectOutputs(p,nSize,vSims,nWordsIn,vVals,vRel_00);
  if (iVar5 != 0) {
    Vec_WrdFreeP(&vRel);
    vRel_00 = vRel;
  }
  Vec_WrdFree(vSims);
  return vRel_00;
}

Assistant:

Vec_Wrd_t * Gia_ManSimRel( Gia_Man_t * p, Vec_Int_t * vObjs, Vec_Wrd_t * vVals )
{
    int nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    int nMints = 1 << Vec_IntSize(vObjs), i, m, iObj;
    Gia_Obj_t * pObj;
    Vec_Wrd_t * vRel  = Vec_WrdStart( nWords * nMints );
    Vec_Wrd_t * vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords * nMints );
    Gia_ManSimRelAssignInputs( p, nWords * nMints, vSims, nWords, p->vSimsPi );
    Vec_IntForEachEntry( vObjs, iObj, i )
        for ( m = 0; m < nMints; m++ )
            if ( (m >> i) & 1 )
                memset( Vec_WrdEntryP(vSims, iObj*nMints*nWords + nWords*m), 0xFF, sizeof(word)*nWords );    
            else
                memset( Vec_WrdEntryP(vSims, iObj*nMints*nWords + nWords*m), 0x00, sizeof(word)*nWords );    
    Gia_ManCleanPhase( p );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->fPhase = 1;
    Gia_ManForEachAnd( p, pObj, i ) 
        if ( !pObj->fPhase )
            Gia_ManSimPatSimAnd( p, i, pObj, nWords * nMints, vSims );
    Gia_ManForEachCo( p, pObj, i )
        if ( !pObj->fPhase )
            Gia_ManSimPatSimPo( p, Gia_ObjId(p, pObj), pObj, nWords * nMints, vSims );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->fPhase = 0;
    if ( Gia_ManSimRelCollectOutputs( p, nWords * nMints, vSims, nWords, vVals, vRel ) )
        Vec_WrdFreeP( &vRel );
    Vec_WrdFree( vSims );
    return vRel;
}